

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

ProFile * __thiscall
QMakeParser::parsedProFile(QMakeParser *this,QString *fileName,ParseFlags flags)

{
  Span *pSVar1;
  bool bVar2;
  int id_00;
  Entry *pEVar3;
  ProFile *pPVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QStringView contents;
  QStringView contents_00;
  iterator iVar6;
  QArrayDataPointer<char16_t> local_58;
  int id;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  id_00 = QMakeVfs::idForFileName(this->m_vfs,fileName,(VfsFlags)0x0);
  id = id_00;
  if ((((uint)flags.super_QFlagsStorageHelper<QMakeParser::ParseFlag,_4>.
              super_QFlagsStorage<QMakeParser::ParseFlag>.i & 1) == 0) ||
     (&this->m_cache->parsed_files == (QHash<int,_ProFileCache::Entry> *)0x0)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (storage_type_conflict *)0x0;
    local_58.size = 0;
    bVar2 = readFile(this,id_00,flags,(QString *)&local_58);
    if (bVar2) {
      contents.m_data = local_58.ptr;
      contents.m_size = local_58.size;
      pPVar4 = parsedProBlock(this,contents,id_00,fileName,1,FullGrammar);
    }
    else {
      pPVar4 = (ProFile *)0x0;
    }
  }
  else {
    iVar6 = QHash<int,_ProFileCache::Entry>::findImpl<int>(&this->m_cache->parsed_files,&id);
    if (iVar6.i.d != (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0 ||
        iVar6.i.bucket != 0) {
      pSVar1 = (iVar6.i.d)->spans;
      uVar5 = iVar6.i.bucket >> 7;
      pPVar4 = *(ProFile **)
                (pSVar1[uVar5].entries[pSVar1[uVar5].offsets[(uint)iVar6.i.bucket & 0x7f]].storage.
                 data + 8);
      if (pPVar4 == (ProFile *)0x0) {
        pPVar4 = (ProFile *)0x0;
      }
      else {
        (pPVar4->m_refCount).m_cnt = (pPVar4->m_refCount).m_cnt + 1;
      }
      goto LAB_002032c2;
    }
    pEVar3 = QHash<int,_ProFileCache::Entry>::operator[](&this->m_cache->parsed_files,&id);
    local_58.d = (Data *)0x0;
    local_58.ptr = (storage_type_conflict *)0x0;
    local_58.size = 0;
    bVar2 = readFile(this,id,flags,(QString *)&local_58);
    if (bVar2) {
      contents_00.m_data = local_58.ptr;
      contents_00.m_size = local_58.size;
      pPVar4 = parsedProBlock(this,contents_00,id,fileName,1,FullGrammar);
      QString::squeeze(&pPVar4->m_proitems);
      (pPVar4->m_refCount).m_cnt = (pPVar4->m_refCount).m_cnt + 1;
    }
    else {
      pPVar4 = (ProFile *)0x0;
    }
    pEVar3->pro = pPVar4;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_002032c2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pPVar4;
  }
  __stack_chk_fail();
}

Assistant:

ProFile *QMakeParser::parsedProFile(const QString &fileName, ParseFlags flags)
{
    ProFile *pro;
    QMakeVfs::VfsFlags vfsFlags = ((flags & ParseCumulative) ? QMakeVfs::VfsCumulative
                                                             : QMakeVfs::VfsExact);
    int id = m_vfs->idForFileName(fileName, vfsFlags);
    if ((flags & ParseUseCache) && m_cache) {
        ProFileCache::Entry *ent;
#ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_cache->mutex);
#endif
        auto it = m_cache->parsed_files.find(id);
        if (it != m_cache->parsed_files.end()) {
            ent = &*it;
#ifdef PROPARSER_THREAD_SAFE
            if (ent->locker && !ent->locker->done) {
                ++ent->locker->waiters;
                QThreadPool::globalInstance()->releaseThread();
                ent->locker->cond.wait(locker.mutex());
                QThreadPool::globalInstance()->reserveThread();
                if (!--ent->locker->waiters) {
                    delete ent->locker;
                    ent->locker = 0;
                }
            }
#endif
            if ((pro = ent->pro))
                pro->ref();
        } else {
            ent = &m_cache->parsed_files[id];
#ifdef PROPARSER_THREAD_SAFE
            ent->locker = new ProFileCache::Entry::Locker;
            locker.unlock();
#endif
            QString contents;
            if (readFile(id, flags, &contents)) {
                pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
                pro->itemsRef()->squeeze();
                pro->ref();
            } else {
                pro = nullptr;
            }
            ent->pro = pro;
#ifdef PROPARSER_THREAD_SAFE
            locker.relock();
            if (ent->locker->waiters) {
                ent->locker->done = true;
                ent->locker->cond.wakeAll();
            } else {
                delete ent->locker;
                ent->locker = 0;
            }
#endif
        }
    } else {
        QString contents;
        if (readFile(id, flags, &contents))
            pro = parsedProBlock(QStringView(contents), id, fileName, 1, FullGrammar);
        else
            pro = nullptr;
    }
    return pro;
}